

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O1

UChar * __thiscall
icu_63::Normalizer2Impl::findNextFCDBoundary(Normalizer2Impl *this,UChar *p,UChar *limit)

{
  UChar UVar1;
  uint16_t norm16;
  UCPTrie *trie;
  UBool UVar2;
  int iVar3;
  UChar *unaff_RBX;
  uint c;
  UChar *pUVar4;
  bool bVar5;
  
  do {
    if (limit <= p) {
      return p;
    }
    pUVar4 = p + 1;
    UVar1 = *p;
    c = (uint)(ushort)UVar1;
    if ((c & 0xf800) == 0xd800) {
      if ((pUVar4 == limit || ((byte)((ushort)UVar1 >> 10) & 1) != 0) ||
         (UVar1 = *pUVar4, ((ushort)UVar1 & 0xfc00) != 0xdc00)) {
        iVar3 = this->normTrie->dataLength + -1;
      }
      else {
        pUVar4 = p + 2;
        c = c * 0x400 + (uint)(ushort)UVar1 + 0xfca02400;
        trie = this->normTrie;
        if ((int)c < trie->highStart) {
          iVar3 = ucptrie_internalSmallIndex_63(trie,c);
        }
        else {
          iVar3 = trie->dataLength + -2;
        }
      }
    }
    else {
      iVar3 = (c & 0x3f) + (uint)this->normTrie->index[(ushort)UVar1 >> 6];
    }
    if ((int)c < (int)(uint)(ushort)this->minLcccCP) {
      bVar5 = false;
      unaff_RBX = p;
    }
    else {
      norm16 = *(uint16_t *)((long)(this->normTrie->data).ptr0 + (long)iVar3 * 2);
      UVar2 = norm16HasDecompBoundaryBefore(this,norm16);
      if (UVar2 == '\0') {
        UVar2 = norm16HasDecompBoundaryAfter(this,norm16);
        bVar5 = UVar2 == '\0';
        if (!bVar5) {
          unaff_RBX = pUVar4;
        }
      }
      else {
        bVar5 = false;
        unaff_RBX = p;
      }
    }
    p = pUVar4;
  } while (bVar5);
  return unaff_RBX;
}

Assistant:

const UChar *Normalizer2Impl::findNextFCDBoundary(const UChar *p, const UChar *limit) const {
    while(p<limit) {
        const UChar *codePointStart=p;
        UChar32 c;
        uint16_t norm16;
        UCPTRIE_FAST_U16_NEXT(normTrie, UCPTRIE_16, p, limit, c, norm16);
        if (c < minLcccCP || norm16HasDecompBoundaryBefore(norm16)) {
            return codePointStart;
        }
        if (norm16HasDecompBoundaryAfter(norm16)) {
            return p;
        }
    }
    return p;
}